

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
~basic_json_encoder(basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                    *this)

{
  basic_json_encode_options<char> *in_RDI;
  stream_sink<char> *in_stack_fffffffffffffff0;
  
  stream_sink<char>::flush(in_stack_fffffffffffffff0);
  std::__cxx11::string::~string((string *)&in_RDI[2].new_line_chars_);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  std::__cxx11::string::~string((string *)&in_RDI[1].field_0xf8);
  std::__cxx11::string::~string((string *)&in_RDI[1].field_0xd8);
  std::__cxx11::string::~string((string *)&in_RDI[1].field_0xb8);
  std::__cxx11::string::~string((string *)&in_RDI[1].field_0x98);
  std::
  vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  ::~vector((vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             *)in_stack_fffffffffffffff0);
  detail::write_double::~write_double((write_double *)0x20fa29);
  basic_json_encode_options<char>::~basic_json_encode_options(in_RDI);
  stream_sink<char>::~stream_sink(in_stack_fffffffffffffff0);
  basic_json_visitor<char>::~basic_json_visitor((basic_json_visitor<char> *)in_RDI);
  return;
}

Assistant:

~basic_json_encoder() noexcept
        {
            JSONCONS_TRY
            {
                sink_.flush();
            }